

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

shared_ptr<Expr> __thiscall Parser::join(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Parser *in_RSI;
  shared_ptr<Expr> sVar2;
  shared_ptr<Token> tok;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<And,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  sVar2 = equality(this);
  _Var1 = sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  while (((in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag == 0x100
        ) {
    std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&(in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
    move(in_RSI);
    equality((Parser *)&stack0xffffffffffffffa0);
    std::make_shared<And,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
              ((shared_ptr<Token> *)&local_40,(shared_ptr<Expr> *)&local_50,(shared_ptr<Expr> *)this
              );
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> join() {
		std::shared_ptr<Expr> x = equality();
		while (look->tag == AND) {
			std::shared_ptr<Token> tok = look; move();
			x = std::make_shared<And>(tok, x, equality());
		}
		return x;
	}